

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EmitterBeam::EmitterBeam
          (EmitterBeam *this,KUINT8 BeamID,KUINT16 BeamParamIndex,FundamentalParameterData *FPD,
          EmitterFunction EBF,HighDensityTrackJam HDTJ,BeamStatus *BS,JammingTechnique *JT)

{
  HighDensityTrackJam HDTJ_local;
  EmitterFunction EBF_local;
  FundamentalParameterData *FPD_local;
  KUINT16 BeamParamIndex_local;
  KUINT8 BeamID_local;
  EmitterBeam *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_003309f8;
  this->m_ui8BeamDataLength = '\r';
  this->m_ui8EmitterBeamIDNumber = BeamID;
  this->m_ui16BeamParamIndex = BeamParamIndex;
  FundamentalParameterData::FundamentalParameterData(&this->m_FundamentalParameterData,FPD);
  this->m_ui8BeamFunction = (KUINT8)EBF;
  this->m_ui8NumTargetInTrackJamField = '\0';
  this->m_ui8HighDensityTrackJam = (KUINT8)HDTJ;
  BeamStatus::BeamStatus(&this->m_BeamStatus,BS);
  JammingTechnique::JammingTechnique(&this->m_JammingTechnique,JT);
  memset(&this->m_vTrackJamTargets,0,0x18);
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::vector(&this->m_vTrackJamTargets);
  return;
}

Assistant:

EmitterBeam::EmitterBeam( KUINT8 BeamID, KUINT16 BeamParamIndex, const FundamentalParameterData & FPD,
                          EmitterFunction EBF, HighDensityTrackJam HDTJ,
#if DIS_VERSION < 7
                          KUINT32 JammingModeSequence ) :
#elif DIS_VERSION > 6
                          const BeamStatus & BS, const JammingTechnique & JT ) :
#endif
  DataTypeBase (),
  m_ui8BeamDataLength ( EMITTER_BEAM_SIZE / 4 ),
  m_ui8EmitterBeamIDNumber ( BeamID ),
  m_ui16BeamParamIndex ( BeamParamIndex ),
  m_FundamentalParameterData ( FPD ),
  m_ui8BeamFunction ( EBF ),
  m_ui8NumTargetInTrackJamField ( 0u ),
  m_ui8HighDensityTrackJam ( HDTJ ),
#if DIS_VERSION < 7
  m_ui8Padding ( 0u ),
  m_ui32JammingModeSequence ( JammingModeSequence ),
#elif DIS_VERSION > 6
  m_BeamStatus ( BS ),
  m_JammingTechnique ( JT ),
#endif
  m_vTrackJamTargets ()
{
}